

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O3

void dynamic_api_suite::api_clear(void)

{
  undefined8 local_38;
  undefined4 local_2c;
  
  local_38 = 1;
  local_2c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x56,"void dynamic_api_suite::api_clear()",&local_38,&local_2c);
  local_38 = 0;
  local_2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x58,"void dynamic_api_suite::api_clear()",&local_38,&local_2c);
  return;
}

Assistant:

void api_clear()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    span.insert({ 11, 1 });
    BOOST_TEST_EQ(span.size(), 1);
    span.clear();
    BOOST_TEST_EQ(span.size(), 0);
}